

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

void __thiscall tok_embed_ctx::start_expr(tok_embed_ctx *this,wchar_t qu,int triple,int report)

{
  int in_ECX;
  int in_EDX;
  wchar_t in_ESI;
  int *in_RDI;
  
  if (*in_RDI < 10) {
    *(int **)(in_RDI + 2) = in_RDI + (long)*in_RDI * 4 + 4;
    tok_embed_level::enter(*(tok_embed_level **)(in_RDI + 2),in_ESI,in_EDX);
  }
  else if (in_ECX != 0) {
    CTcTokenizer::log_error(0x2754);
  }
  *in_RDI = *in_RDI + 1;
  return;
}

Assistant:

void tok_embed_ctx::start_expr(wchar_t qu, int triple, int report)
{
	if (level < (int)countof(stk))
    {
        s = stk + level;
        s->enter(qu, triple);
    }
    else if (report)
    {
        G_tok->log_error(TCERR_EMBEDDING_TOO_DEEP);
    }
    ++level;
}